

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_test.c
# Opt level: O3

void test_no_clustering(void)

{
  nng_err num;
  char *pcVar1;
  char *pcVar2;
  char *local_48;
  char *av [2];
  char *local_30;
  int local_28;
  int local_24;
  int opti;
  int v;
  
  local_28 = 1;
  local_48 = "program";
  av[0] = "-fv";
  num = nng_args_parse(2,&local_48,(nng_arg_spec *)&DAT_00153f40,&local_24,&local_30,&local_28);
  pcVar1 = nng_strerror(~NNG_EINTR);
  acutest_check_((uint)(num == ~NNG_EINTR),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0x143,"%s fails with %s","nng_args_parse(ac, av, spec, &v, &a, &opti)",pcVar1);
  pcVar1 = nng_strerror(~NNG_EINTR);
  pcVar2 = nng_strerror(num);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_args_parse(ac, av, spec, &v, &a, &opti)"
                   ,pcVar1,0xfffffffe,pcVar2,(ulong)num);
  return;
}

Assistant:

void
test_no_clustering(void)
{
	int   opti = 1;
	char *av[2];
	int   ac = 2;
	int   v;
	char *a = NULL;

	nng_arg_spec spec[] = {
		{ "flag", 'f', 1, false },
		{ "verbose", 'v', 2, false },
		{ NULL, 0, 0, false },
	};

	av[0] = "program";
	av[1] = "-fv";
	NUTS_FAIL(nng_args_parse(ac, av, spec, &v, &a, &opti), NNG_ARG_INVAL);
}